

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O1

bool TimidityPPMIDIDevice::FillStream(SoundStream *stream,void *buff,int len,void *userdata)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  size_t __nbytes;
  timeval tv;
  fd_set rfds;
  timeval local_b8;
  fd_set local_a8;
  
  iVar3 = ChildQuit;
  iVar1 = *(int *)((long)userdata + 0x28);
  if (ChildQuit == iVar1) {
    FillStream((TimidityPPMIDIDevice *)((long)userdata + 0x28));
  }
  else {
    local_a8.fds_bits[0xe] = 0;
    local_a8.fds_bits[0xf] = 0;
    local_a8.fds_bits[0xc] = 0;
    local_a8.fds_bits[0xd] = 0;
    local_a8.fds_bits[10] = 0;
    local_a8.fds_bits[0xb] = 0;
    local_a8.fds_bits[8] = 0;
    local_a8.fds_bits[9] = 0;
    local_a8.fds_bits[6] = 0;
    local_a8.fds_bits[7] = 0;
    local_a8.fds_bits[4] = 0;
    local_a8.fds_bits[5] = 0;
    local_a8.fds_bits[2] = 0;
    local_a8.fds_bits[3] = 0;
    local_a8.fds_bits[0] = 0;
    local_a8.fds_bits[1] = 0;
    iVar2 = *(int *)((long)userdata + 0x20);
    iVar4 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    local_a8.fds_bits[iVar4 >> 6] =
         local_a8.fds_bits[iVar4 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    local_b8.tv_sec = 0;
    local_b8.tv_usec = 0x32;
    select(1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
    __nbytes = (size_t)len;
    sVar5 = read(*(int *)((long)userdata + 0x20),buff,__nbytes);
    if (__nbytes - sVar5 != 0 && sVar5 <= (long)__nbytes) {
      memset((void *)((long)buff + sVar5),0,__nbytes - sVar5);
    }
  }
  return iVar3 != iVar1;
}

Assistant:

bool TimidityPPMIDIDevice::FillStream(SoundStream *stream, void *buff, int len, void *userdata)
{
	TimidityPPMIDIDevice *song = (TimidityPPMIDIDevice *)userdata;
	
#ifdef _WIN32
	DWORD avail, got, didget;

	if (!PeekNamedPipe(song->ReadWavePipe, NULL, 0, NULL, &avail, NULL) || avail == 0)
	{ // If nothing is available from the pipe, play silence.
		memset (buff, 0, len);
	}
	else
	{
		didget = 0;
		for (;;)
		{
			ReadFile(song->ReadWavePipe, (BYTE *)buff+didget, len-didget, &got, NULL);
			didget += got;
			if (didget >= (DWORD)len)
				break;

			// Give TiMidity++ a chance to output something more to the pipe
			Sleep (10);
			if (!PeekNamedPipe(song->ReadWavePipe, NULL, 0, NULL, &avail, NULL) || avail == 0)
			{
				memset ((BYTE *)buff+didget, 0, len-didget);
				break;
			}
		} 
	}
#else
	ssize_t got;
	fd_set rfds;
	struct timeval tv;

	if (ChildQuit == song->ChildProcess)
	{
		ChildQuit = 0;
		fprintf(stderr, "child gone\n");
		song->ChildProcess = -1;
		return false;
	}

	FD_ZERO(&rfds);
	FD_SET(song->WavePipe[0], &rfds);
	tv.tv_sec = 0;
	tv.tv_usec = 50;
//	fprintf(stderr,"select\n");
	if (select(1, &rfds, NULL, NULL, &tv) <= 0 && 0)
	{ // Nothing available, so play silence.
//	fprintf(stderr,"nothing\n");
	 //   memset(buff, 0, len);
	    return true;
	}
//	fprintf(stderr,"something\n");

	got = read(song->WavePipe[0], (BYTE *)buff, len);
	if (got < len)
	{
		memset((BYTE *)buff+got, 0, len-got);
	}
#endif
	return true;
}